

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# no_field_presence_test.cc
# Opt level: O3

void __thiscall
google::protobuf::anon_unknown_0::NoFieldPresenceTest_CopyTwiceDefaultStringFieldTest_Test::TestBody
          (NoFieldPresenceTest_CopyTwiceDefaultStringFieldTest_Test *this)

{
  TestAllTypes dst;
  TestAllTypes src;
  TestAllTypes TStack_568;
  TestAllTypes local_2b8;
  
  proto2_nofieldpresence_unittest::TestAllTypes::TestAllTypes(&local_2b8,(Arena *)0x0);
  proto2_nofieldpresence_unittest::TestAllTypes::TestAllTypes(&TStack_568,(Arena *)0x0);
  proto2_nofieldpresence_unittest::TestAllTypes::CopyFrom(&TStack_568,&local_2b8);
  proto2_nofieldpresence_unittest::TestAllTypes::CopyFrom(&TStack_568,&local_2b8);
  proto2_nofieldpresence_unittest::TestAllTypes::~TestAllTypes(&TStack_568);
  proto2_nofieldpresence_unittest::TestAllTypes::~TestAllTypes(&local_2b8);
  return;
}

Assistant:

TEST(NoFieldPresenceTest, CopyTwiceDefaultStringFieldTest) {
  // As an optimization, we maintain a default string in memory and messages
  // with uninitialized fields will be constructed with a pointer to this
  // default string object. The destructor should clear the field only when it
  // is "set" to a nondefault object.
  TestAllTypes src, dst;

  dst = src;
  dst = src;
}